

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicIteratedExprBuilder<mp::CallExpr> __thiscall
mp::BasicExprFactory<std::allocator<char>_>::BeginIterated<mp::CallExpr>
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,int num_args)

{
  SafeInt<int> n;
  Impl *impl_00;
  int in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  BasicIteratedExprBuilder<mp::CallExpr> BVar1;
  Impl *impl;
  SafeInt<int> size;
  SafeInt<int> in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd8;
  SafeInt<int> in_stack_ffffffffffffffdc;
  undefined1 local_10 [12];
  
  SafeInt<int>::SafeInt((SafeInt<int> *)&stack0xffffffffffffffdc,8);
  n = mp::operator*(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  mp::val(n);
  impl_00 = Allocate<mp::CallExpr>
                      ((BasicExprFactory<std::allocator<char>_> *)CONCAT44(in_ESI,in_EDX),
                       in_stack_ffffffffffffffdc.value_,in_stack_ffffffffffffffd8);
  impl_00->num_args = in_EDX;
  BasicIteratedExprBuilder<mp::CallExpr>::BasicIteratedExprBuilder
            ((BasicIteratedExprBuilder<mp::CallExpr> *)local_10,impl_00);
  BVar1._12_4_ = 0;
  BVar1.impl_ = (Impl *)local_10._0_8_;
  BVar1.arg_index_ = local_10._8_4_;
  return BVar1;
}

Assistant:

BasicIteratedExprBuilder<ExprType> BeginIterated(
        expr::Kind kind, int num_args) {
    MP_ASSERT(num_args >= 0, "invalid number of arguments");
    SafeInt<int> size = sizeof(Expr::Impl*);
    typename ExprType::Impl *impl =
        Allocate<ExprType>(kind, val(size * (num_args - 1)));
    impl->num_args = num_args;
    return BasicIteratedExprBuilder<ExprType>(impl);
  }